

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrExp.c
# Opt level: O3

void Rwt_Man4ExplorePrint(void)

{
  int *piVar1;
  size_t __size;
  uint uVar2;
  int iVar3;
  int *piVar4;
  ulong in_RAX;
  void *__ptr;
  uint *__ptr_00;
  FILE *__stream;
  Rwr_Man4_t *pRVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint *Sign;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if ((long)s_pManRwrExp4->nFuncs < 1) {
    uVar9 = 0;
    uVar8 = 0;
    uVar10 = 0;
  }
  else {
    uVar7 = 0;
    uVar10 = 0;
    uVar8 = 0;
    uVar9 = 0;
    do {
      uVar2 = s_pManRwrExp4->pnCounts[uVar7];
      if ((int)uVar9 <= (int)uVar2) {
        uVar9 = uVar2;
      }
      uVar8 = (ulong)((int)uVar8 + uVar2);
      uVar10 = (ulong)((int)uVar10 + (uint)(0 < (int)uVar2));
      uVar7 = uVar7 + 1;
      uStack_38 = CONCAT44((int)uVar7,(undefined4)uStack_38);
    } while (uVar7 < (ulong)(long)s_pManRwrExp4->nFuncs);
  }
  printf("Number of cuts considered       = %8d.\n",uVar8);
  printf("Classes occurring at least once = %8d.\n",uVar10);
  __size = (ulong)uVar9 * 4 + 4;
  __ptr = calloc(1,__size);
  __ptr_00 = (uint *)malloc(__size);
  iVar6 = s_pManRwrExp4->nFuncs;
  if (0 < (long)iVar6) {
    piVar4 = s_pManRwrExp4->pnCounts;
    uVar8 = 0;
    do {
      iVar3 = piVar4[uVar8];
      piVar1 = (int *)((long)__ptr + (long)iVar3 * 4);
      *piVar1 = *piVar1 + 1;
      __ptr_00[iVar3] = (uint)uVar8;
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)(long)iVar6);
  }
  printf("Occurence = %6d.  Num classes = %4d.  \n",0,(ulong)(0x8f0 - (int)uVar10));
  if ((int)uVar9 < 1) {
    if (__ptr == (void *)0x0) goto LAB_00447606;
  }
  else {
    uVar10 = 1;
    Sign = __ptr_00;
    do {
      Sign = Sign + 1;
      if (*(int *)((long)__ptr + uVar10 * 4) != 0) {
        printf("Occurence = %6d.  Num classes = %4d.  Repr = ",uVar10 & 0xffffffff);
        Extra_PrintBinary(_stdout,Sign,0x10);
        putchar(10);
      }
      uVar10 = uVar10 + 1;
    } while ((ulong)uVar9 + 1 != uVar10);
  }
  free(__ptr);
LAB_00447606:
  if (__ptr_00 != (uint *)0x0) {
    free(__ptr_00);
  }
  __stream = fopen("npnclass_stats4.txt","w");
  uStack_38 = uStack_38 & 0xffffffff;
  if (s_pManRwrExp4->nFuncs < 1) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    iVar6 = 0;
    pRVar5 = s_pManRwrExp4;
    do {
      if (0 < pRVar5->pnCounts[iVar6]) {
        Extra_PrintHex((FILE *)__stream,(uint *)((long)&uStack_38 + 4),4);
        fprintf(__stream," %10d\n",(ulong)(uint)s_pManRwrExp4->pnCounts[uStack_38._4_4_]);
        uVar9 = uVar9 + 1;
        pRVar5 = s_pManRwrExp4;
        iVar6 = uStack_38._4_4_;
      }
      iVar6 = iVar6 + 1;
      uStack_38 = CONCAT44(iVar6,(undefined4)uStack_38);
    } while (iVar6 < pRVar5->nFuncs);
  }
  fclose(__stream);
  printf("%d classes written into file \"%s\".\n",(ulong)uVar9,"npnclass_stats4.txt");
  return;
}

Assistant:

void Rwt_Man4ExplorePrint()
{
    FILE * pFile;
    int i, CountMax, CountWrite, nCuts, nClasses;
    int * pDistrib;
    int * pReprs;
    // find the max number of occurences
    nCuts = nClasses = 0;
    CountMax = 0;
    for ( i = 0; i < s_pManRwrExp4->nFuncs; i++ )
    {
        if ( CountMax < s_pManRwrExp4->pnCounts[i] )
            CountMax = s_pManRwrExp4->pnCounts[i];
        nCuts += s_pManRwrExp4->pnCounts[i];
        if ( s_pManRwrExp4->pnCounts[i] > 0 )
            nClasses++;
    }
    printf( "Number of cuts considered       = %8d.\n", nCuts );
    printf( "Classes occurring at least once = %8d.\n", nClasses );
    // print the distribution of classes
    pDistrib = ABC_ALLOC( int, CountMax + 1 );
    pReprs   = ABC_ALLOC( int, CountMax + 1 );
    memset( pDistrib, 0, sizeof(int)*(CountMax + 1) );
    for ( i = 0; i < s_pManRwrExp4->nFuncs; i++ )
    {
        pDistrib[ s_pManRwrExp4->pnCounts[i] ]++;
        pReprs[ s_pManRwrExp4->pnCounts[i] ] = i;
    }

    printf( "Occurence = %6d.  Num classes = %4d.  \n", 0, 2288-nClasses );
    for ( i = 1; i <= CountMax; i++ )
        if ( pDistrib[i] )
        {
            printf( "Occurence = %6d.  Num classes = %4d.  Repr = ", i, pDistrib[i] );
            Extra_PrintBinary( stdout, (unsigned*)&(pReprs[i]), 16 ); 
            printf( "\n" );
        }
    ABC_FREE( pDistrib );
    ABC_FREE( pReprs );
    // write into a file all classes above limit (5)
    CountWrite = 0;
    pFile = fopen( "npnclass_stats4.txt", "w" );
    for ( i = 0; i < s_pManRwrExp4->nFuncs; i++ )
        if ( s_pManRwrExp4->pnCounts[i] > 0 )
        {
            Extra_PrintHex( pFile, (unsigned *)&i, 4 );
            fprintf( pFile, " %10d\n", s_pManRwrExp4->pnCounts[i] );
//            fprintf( pFile, "%d ", i );
            CountWrite++;
        }
    fclose( pFile );
    printf( "%d classes written into file \"%s\".\n", CountWrite, "npnclass_stats4.txt" );
}